

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O3

void __thiscall
wasm_functype_t::wasm_functype_t
          (wasm_functype_t *this,wasm_valtype_vec_t *params,wasm_valtype_vec_t *results)

{
  wasm_valtype_t **ppwVar1;
  pointer *__ptr;
  ExternType *local_68;
  ValueTypes local_60;
  ValueTypes local_48;
  
  ToWabtValueTypes(&local_60,params);
  ToWabtValueTypes(&local_48,results);
  wabt::
  MakeUnique<wabt::interp::FuncType,std::vector<wabt::Type,std::allocator<wabt::Type>>,std::vector<wabt::Type,std::allocator<wabt::Type>>>
            ((wabt *)&local_68,&local_60,&local_48);
  (this->super_wasm_externtype_t)._vptr_wasm_externtype_t =
       (_func_int **)&PTR__wasm_externtype_t_001e4c30;
  (this->super_wasm_externtype_t).I._M_t.
  super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>.
  _M_t.
  super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
  .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl = local_68;
  local_68 = (ExternType *)0x0;
  if (local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  (this->super_wasm_externtype_t)._vptr_wasm_externtype_t =
       (_func_int **)&PTR__wasm_functype_t_001e4be8;
  ppwVar1 = params->data;
  (this->params).size = params->size;
  (this->params).data = ppwVar1;
  ppwVar1 = results->data;
  (this->results).size = results->size;
  (this->results).data = ppwVar1;
  return;
}

Assistant:

wasm_functype_t(own wasm_valtype_vec_t* params,
                  own wasm_valtype_vec_t* results)
      : wasm_externtype_t{MakeUnique<FuncType>(ToWabtValueTypes(params),
                                               ToWabtValueTypes(results))},
        params(*params),
        results(*results) {}